

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

void __thiscall testing::internal::RE::RE(RE *this,string *regex)

{
  (this->pattern_)._M_dataplus._M_p = (pointer)&(this->pattern_).field_2;
  (this->pattern_)._M_string_length = 0;
  (this->pattern_).field_2._M_local_buf[0] = '\0';
  Init(this,(regex->_M_dataplus)._M_p);
  return;
}

Assistant:

RE(const char* regex) { Init(regex); }